

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cc
# Opt level: O3

void __thiscall hgdb::rtl::Serializer::handle(Serializer *this,CaseStatement *stmt)

{
  Expression *pEVar1;
  size_type sVar2;
  pointer ppEVar3;
  Statement *stmt_00;
  SourceLocation SVar4;
  pointer pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_1;
  SourceLocation SVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  pointer pIVar7;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values_str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_conditions;
  string target_str;
  ExpressionPrinter p;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  char *local_268;
  undefined8 local_260;
  CaseStatement *local_258;
  Serializer *local_250;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_210;
  size_type sStack_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  pointer local_1f0;
  string *local_1e8;
  pointer local_1e0;
  undefined1 *local_1d8;
  code *local_1d0;
  undefined1 local_1c8 [136];
  ios_base local_140 [272];
  
  local_1c8._0_8_ = &local_278;
  pEVar1 = stmt->expr;
  local_210 = &local_200;
  sStack_208 = 0;
  local_200._M_local_buf[0] = '\0';
  local_278._M_allocated_capacity = (size_type)(pEVar1->sourceRange).startLoc;
  local_258 = stmt;
  local_250 = this;
  std::__cxx11::stringstream::stringstream((stringstream *)(local_1c8 + 8));
  slang::ast::Expression::
  visitExpression<slang::ast::Expression_const,hgdb::rtl::ExpressionPrinter&>
            (pEVar1,pEVar1,(ExpressionPrinter *)local_1c8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_210,(string *)local_278._M_local_buf);
  if ((char **)local_278._M_allocated_capacity != &local_268) {
    operator_delete((void *)local_278._M_allocated_capacity,(ulong)(local_268 + 1));
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c8 + 8));
  std::ios_base::~ios_base(local_140);
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar2 = (local_258->items).size_;
  if (sVar2 != 0) {
    pIVar7 = (local_258->items).data_;
    local_1f0 = pIVar7 + sVar2;
    local_1e8 = (string *)&local_250->current_condition_;
    do {
      ppEVar3 = (pIVar7->expressions).data_;
      sVar2 = (pIVar7->expressions).size_;
      local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve(&local_248,sVar2);
      SVar6 = (SourceLocation)
              local_248.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      SVar4 = (SourceLocation)
              local_248.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      local_1e0 = pIVar7;
      if (sVar2 != 0) {
        lVar8 = 0;
        do {
          pEVar1 = *(Expression **)((long)ppEVar3 + lVar8);
          if (pEVar1 != (Expression *)0x0) {
            local_278._M_allocated_capacity = (size_type)(pEVar1->sourceRange).startLoc;
            local_1c8._0_8_ = &local_278;
            std::__cxx11::stringstream::stringstream((stringstream *)(local_1c8 + 8));
            slang::ast::Expression::
            visitExpression<slang::ast::Expression_const,hgdb::rtl::ExpressionPrinter&>
                      (pEVar1,pEVar1,(ExpressionPrinter *)local_1c8);
            std::__cxx11::stringbuf::str();
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_248,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_278);
            if ((char **)local_278._M_allocated_capacity != &local_268) {
              operator_delete((void *)local_278._M_allocated_capacity,(ulong)(local_268 + 1));
            }
            if (local_258->defaultCase != (Statement *)0x0) {
              std::__cxx11::stringbuf::str();
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_228,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_278);
              if ((char **)local_278._M_allocated_capacity != &local_268) {
                operator_delete((void *)local_278._M_allocated_capacity,(ulong)(local_268 + 1));
              }
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c8 + 8));
            std::ios_base::~ios_base(local_140);
          }
          lVar8 = lVar8 + 8;
          SVar6 = (SourceLocation)
                  local_248.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          SVar4 = (SourceLocation)
                  local_248.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        } while (sVar2 << 3 != lVar8);
      }
      for (; pbVar5 = local_248.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
          SVar6 != (SourceLocation)
                   local_248.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          SVar6 = (SourceLocation)((long)SVar6 + 0x20)) {
        local_1c8._16_8_ = *(undefined8 *)SVar6;
        local_1c8._24_8_ = *(undefined8 *)((long)SVar6 + 8);
        fmt.size_ = 0xdd;
        fmt.data_ = (char *)0xc;
        args.field_1.values_ = in_R9.values_;
        args.desc_ = (unsigned_long_long)local_1c8;
        local_248.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)SVar4;
        local_1c8._0_8_ = local_210;
        local_1c8._8_8_ = sStack_208;
        ::fmt::v9::vformat_abi_cxx11_((string *)&local_278,(v9 *)"({0} == {1})",fmt,args);
        std::__cxx11::string::operator=((string *)SVar6,(string *)local_278._M_local_buf);
        if ((char **)local_278._M_allocated_capacity != &local_268) {
          operator_delete((void *)local_278._M_allocated_capacity,(ulong)(local_268 + 1));
        }
        SVar4 = (SourceLocation)
                local_248.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
        local_248.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
      }
      local_268 = " && ";
      local_260 = 4;
      local_1d0 = ::fmt::v9::detail::value<fmt::v9::basic_format_context<fmt::v9::appender,char>>::
                  format_custom_arg<fmt::v9::join_view<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char>,fmt::v9::formatter<fmt::v9::join_view<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char>,char,void>>
      ;
      fmt_00.size_ = 0xf;
      fmt_00.data_ = (char *)0x3;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)&local_1d8;
      local_278._M_allocated_capacity =
           (size_type)
           local_248.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_278._8_8_ = SVar4;
      local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)SVar4;
      local_1d8 = (undefined1 *)&local_278;
      ::fmt::v9::vformat_abi_cxx11_((string *)local_1c8,(v9 *)0x3e67f6,fmt_00,args_00);
      pIVar7 = local_1e0;
      std::__cxx11::string::operator=(local_1e8,(string *)local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1c8 + 0x10)) {
        operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
      }
      stmt_00 = (pIVar7->stmt).ptr;
      if (stmt_00 == (Statement *)0x0) {
        slang::assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,
                   "T slang::not_null<const slang::ast::Statement *>::get() const [T = const slang::ast::Statement *]"
                  );
      }
      visit_block_stmt(local_250,stmt_00);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_248);
      pIVar7 = pIVar7 + 1;
    } while (pIVar7 != local_1f0);
  }
  pbVar5 = local_228.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_258->defaultCase != (Statement *)0x0) {
    if (local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      SVar6 = (SourceLocation)
              local_228.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_1c8._16_8_ = *(undefined8 *)SVar6;
        local_1c8._24_8_ = *(undefined8 *)((long)SVar6 + 8);
        local_1c8._0_8_ = local_210;
        local_1c8._8_8_ = sStack_208;
        fmt_01.size_ = 0xdd;
        fmt_01.data_ = (char *)0xc;
        args_01.field_1.values_ = in_R9.values_;
        args_01.desc_ = (unsigned_long_long)local_1c8;
        ::fmt::v9::vformat_abi_cxx11_((string *)&local_278,(v9 *)"({0} != {1})",fmt_01,args_01);
        std::__cxx11::string::operator=((string *)SVar6,(string *)local_278._M_local_buf);
        if ((char **)local_278._M_allocated_capacity != &local_268) {
          operator_delete((void *)local_278._M_allocated_capacity,(ulong)(local_268 + 1));
        }
        SVar6 = (SourceLocation)((long)SVar6 + 0x20);
      } while (SVar6 != (SourceLocation)pbVar5);
    }
    local_278._M_allocated_capacity =
         (size_type)
         local_228.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_278._8_8_ =
         local_228.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_268 = " && ";
    local_260 = 4;
    local_248.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)::fmt::v9::detail::value<fmt::v9::basic_format_context<fmt::v9::appender,char>>::
                  format_custom_arg<fmt::v9::join_view<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char>,fmt::v9::formatter<fmt::v9::join_view<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char>,char,void>>
    ;
    fmt_02.size_ = 0xf;
    fmt_02.data_ = (char *)0x3;
    args_02.field_1.values_ = in_R9.values_;
    args_02.desc_ = (unsigned_long_long)&local_248;
    local_248.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_278;
    ::fmt::v9::vformat_abi_cxx11_((string *)local_1c8,(v9 *)0x3e67f6,fmt_02,args_02);
    std::__cxx11::string::operator=((string *)&local_250->current_condition_,(string *)local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_1c8 + 0x10)) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    visit_block_stmt(local_250,local_258->defaultCase);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  if (local_210 != &local_200) {
    operator_delete(local_210,
                    CONCAT71(local_200._M_allocated_capacity._1_7_,local_200._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void handle(const slang::ast::CaseStatement &stmt) {
        auto const &target = stmt.expr;
        std::string target_str;
        {
            ExpressionPrinter p(target.sourceRange.start());
            target.visit(p);
            target_str = p.str();
        }

        std::vector<std::string> all_conditions;

        for (auto const &case_ : stmt.items) {
            auto values = case_.expressions;
            std::vector<std::string> values_str;
            values_str.reserve(values.size());
            for (auto *e : values) {
                if (e) {
                    ExpressionPrinter p(e->sourceRange.start());
                    e->visit(p);
                    values_str.emplace_back(p.str());
                    if (stmt.defaultCase) {
                        all_conditions.emplace_back(p.str());
                    }
                }
            }
            for (auto &s : values_str) {
                s = fmt::format("({0} == {1})", target_str, s);
            }
            current_condition_ =
                fmt::format("{0}", fmt::join(values_str.begin(), values_str.end(), " && "));
            visit_block_stmt(case_.stmt);
        }

        if (stmt.defaultCase) {
            for (auto &s : all_conditions) {
                s = fmt::format("({0} != {1})", target_str, s);
            }
            current_condition_ =
                fmt::format("{0}", fmt::join(all_conditions.begin(), all_conditions.end(), " && "));
            visit_block_stmt(stmt.defaultCase);
        }
    }